

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

column_t<relive::Track,_int,_const_int_&(relive::Track::*)()_const,_void_(relive::Track::*)(int)> *
__thiscall
sqlite_orm::make_column<relive::Track,int,void>
          (column_t<relive::Track,_int,_const_int_&(relive::Track::*)()_const,_void_(relive::Track::*)(int)>
           *__return_storage_ptr__,sqlite_orm *this,string *name,statement_type m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *local_40;
  size_type local_38;
  char local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,*(long *)this,*(long *)(this + 8) + *(long *)this);
  paVar1 = &(__return_storage_ptr__->super_column_base).name.field_2;
  (__return_storage_ptr__->super_column_base).name._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    *(undefined8 *)((long)&(__return_storage_ptr__->super_column_base).name.field_2 + 8) = uStack_28
    ;
  }
  else {
    (__return_storage_ptr__->super_column_base).name._M_dataplus._M_p = local_40;
    (__return_storage_ptr__->super_column_base).name.field_2._M_allocated_capacity =
         CONCAT71(uStack_2f,local_30);
  }
  (__return_storage_ptr__->super_column_base).name._M_string_length = local_38;
  __return_storage_ptr__->member_pointer = (member_pointer_t)name;
  __return_storage_ptr__->getter = 0;
  *(undefined8 *)&__return_storage_ptr__->field_0x30 = 0;
  __return_storage_ptr__->setter = 0;
  *(undefined8 *)&__return_storage_ptr__->field_0x40 = 0;
  return __return_storage_ptr__;
}

Assistant:

internal::column_t<O, T, const T &(O::*)() const, void (O::*)(T), Op...>
make_column(const std::string &name, T O::*m, Op... constraints) {
    static_assert(constraints::template constraints_size<Op...>::value == std::tuple_size<std::tuple<Op...>>::value,
                  "Incorrect constraints pack");
    static_assert(internal::is_field_member_pointer<T O::*>::value,
                  "second argument expected as a member field pointer, not member function pointer");
    return {name, m, nullptr, nullptr, std::make_tuple(constraints...)};
}